

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_elements_transaction.cpp
# Opt level: O3

int CfdGetBlindTxBlindData
              (void *handle,void *blind_handle,uint32_t index,uint32_t *vout,char **asset,
              int64_t *value_satoshi,char **asset_blind_factor,char **value_blind_factor,
              char **issuance_txid,uint32_t *issuance_vout,bool *is_issuance_asset,
              bool *is_issuance_token)

{
  long *plVar1;
  uint32_t uVar2;
  ulong uVar3;
  char *pcVar4;
  int64_t iVar5;
  char *pcVar6;
  char *pcVar7;
  CfdException *pCVar8;
  ulong uVar9;
  uint32_t *puVar10;
  Amount AVar11;
  char *work_asset_blind_factor;
  char *work_asset;
  undefined1 local_a8 [8];
  int local_a0;
  char *local_98 [2];
  void *local_88;
  char **local_80;
  char *local_78;
  char *local_70;
  char *local_68;
  char *local_60;
  undefined8 local_58;
  Txid local_50;
  
  local_68 = (char *)0x0;
  local_70 = (char *)0x0;
  local_78 = (char *)0x0;
  local_58 = 0;
  local_88 = handle;
  local_80 = asset;
  cfd::Initialize();
  local_a8 = (undefined1  [8])local_98;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,"BlindTxData","");
  cfd::capi::CheckBuffer(blind_handle,(string *)local_a8);
  if (local_a8 != (undefined1  [8])local_98) {
    operator_delete((void *)local_a8);
  }
  plVar1 = *(long **)((long)blind_handle + 0x38);
  if (plVar1 == (long *)0x0) {
    local_a8 = (undefined1  [8])0x5e1cf2;
    local_a0 = 0x5b5;
    local_98[0] = "CfdGetBlindTxBlindData";
    cfd::core::logger::log<>
              ((CfdSourceLocation *)local_a8,kCfdLogLevelWarning,"buffer state is illegal.");
    pCVar8 = (CfdException *)__cxa_allocate_exception(0x30);
    local_a8 = (undefined1  [8])local_98;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_a8,"Failed to parameter. buffer state is illegal.","");
    cfd::core::CfdException::CfdException(pCVar8,kCfdOutOfRangeError,(string *)local_a8);
    __cxa_throw(pCVar8,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  if (*(char *)((long)blind_handle + 0x30) == '\0') {
    local_a8 = (undefined1  [8])0x5e1cf2;
    local_a0 = 0x5bb;
    local_98[0] = "CfdGetBlindTxBlindData";
    cfd::core::logger::log<>
              ((CfdSourceLocation *)local_a8,kCfdLogLevelWarning,"unused collect blinder.");
    pCVar8 = (CfdException *)__cxa_allocate_exception(0x30);
    local_a8 = (undefined1  [8])local_98;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_a8,"Failed to collect state. unused collect blinder.","");
    cfd::core::CfdException::CfdException(pCVar8,kCfdIllegalArgumentError,(string *)local_a8);
    __cxa_throw(pCVar8,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  uVar3 = (ulong)index;
  uVar9 = (plVar1[1] - *plVar1 >> 3) * -0x70a3d70a3d70a3d7;
  if (uVar9 < uVar3 || uVar9 - uVar3 == 0) {
    local_a8 = (undefined1  [8])0x5e1cf2;
    local_a0 = 0x5c1;
    local_98[0] = "CfdGetBlindTxBlindData";
    cfd::core::logger::log<>
              ((CfdSourceLocation *)local_a8,kCfdLogLevelWarning,"index out of range.");
    pCVar8 = (CfdException *)__cxa_allocate_exception(0x30);
    local_a8 = (undefined1  [8])local_98;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_a8,"Failed to parameter. index out of range.","");
    cfd::core::CfdException::CfdException(pCVar8,kCfdOutOfRangeError,(string *)local_a8);
    __cxa_throw(pCVar8,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  puVar10 = (uint32_t *)(*plVar1 + uVar3 * 200);
  if (vout != (uint32_t *)0x0) {
    *vout = *puVar10;
  }
  if (local_80 == (char **)0x0) {
    pcVar4 = (char *)0x0;
  }
  else {
    cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_
              ((string *)local_a8,(ConfidentialAssetId *)(puVar10 + 2));
    pcVar4 = cfd::capi::CreateString((string *)local_a8);
    local_68 = pcVar4;
    if (local_a8 != (undefined1  [8])local_98) {
      operator_delete((void *)local_a8);
    }
  }
  if (value_satoshi != (int64_t *)0x0) {
    AVar11 = cfd::core::ConfidentialValue::GetAmount((ConfidentialValue *)(puVar10 + 0x1c));
    local_a8 = (undefined1  [8])AVar11.amount_;
    local_a0 = CONCAT31(local_a0._1_3_,AVar11.ignore_check_);
    iVar5 = cfd::core::Amount::GetSatoshiValue((Amount *)local_a8);
    *value_satoshi = iVar5;
  }
  if (asset_blind_factor == (char **)0x0) {
    local_60 = (char *)0x0;
  }
  else {
    cfd::core::BlindFactor::GetHex_abi_cxx11_((string *)local_a8,(BlindFactor *)(puVar10 + 0xc));
    local_60 = cfd::capi::CreateString((string *)local_a8);
    local_70 = local_60;
    if (local_a8 != (undefined1  [8])local_98) {
      operator_delete((void *)local_a8);
    }
  }
  if (value_blind_factor == (char **)0x0) {
    pcVar6 = (char *)0x0;
  }
  else {
    cfd::core::BlindFactor::GetHex_abi_cxx11_((string *)local_a8,(BlindFactor *)(puVar10 + 0x14));
    pcVar6 = cfd::capi::CreateString((string *)local_a8);
    local_78 = pcVar6;
    if (local_a8 != (undefined1  [8])local_98) {
      operator_delete((void *)local_a8);
    }
  }
  if (issuance_vout == (uint32_t *)0x0 || issuance_txid == (char **)0x0) {
    pcVar7 = (char *)0x0;
  }
  else {
    uVar2 = cfd::core::OutPoint::GetVout((OutPoint *)(puVar10 + 0x26));
    *issuance_vout = uVar2;
    cfd::core::OutPoint::GetTxid(&local_50,(OutPoint *)(puVar10 + 0x26));
    cfd::core::Txid::GetHex_abi_cxx11_((string *)local_a8,&local_50);
    pcVar7 = cfd::capi::CreateString((string *)local_a8);
    if (local_a8 != (undefined1  [8])local_98) {
      operator_delete((void *)local_a8);
    }
    local_50._vptr_Txid = (_func_int **)&PTR__Txid_00723450;
    if (local_50.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_50.data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
  }
  if (is_issuance_asset != (bool *)0x0) {
    *is_issuance_asset = SUB41(puVar10[0x30],0);
  }
  if (is_issuance_token != (bool *)0x0) {
    *is_issuance_token = *(bool *)((long)puVar10 + 0xc1);
  }
  if (pcVar4 != (char *)0x0) {
    *local_80 = pcVar4;
  }
  if (local_60 != (char *)0x0) {
    *asset_blind_factor = local_60;
  }
  if (pcVar6 != (char *)0x0) {
    *value_blind_factor = pcVar6;
  }
  if (pcVar7 != (char *)0x0) {
    *issuance_txid = pcVar7;
  }
  return 0;
}

Assistant:

int CfdGetBlindTxBlindData(
    void* handle, void* blind_handle, uint32_t index, uint32_t* vout,
    char** asset, int64_t* value_satoshi, char** asset_blind_factor,
    char** value_blind_factor, char** issuance_txid, uint32_t* issuance_vout,
    bool* is_issuance_asset, bool* is_issuance_token) {
  int result = CfdErrorCode::kCfdUnknownError;
  char* work_asset = nullptr;
  char* work_asset_blind_factor = nullptr;
  char* work_value_blind_factor = nullptr;
  char* work_txid = nullptr;
  try {
    cfd::Initialize();
    CheckBuffer(blind_handle, kPrefixBlindTxData);

    CfdCapiBlindTxData* buffer =
        static_cast<CfdCapiBlindTxData*>(blind_handle);
    if (buffer->blinder_list == nullptr) {
      warn(CFD_LOG_SOURCE, "buffer state is illegal.");
      throw CfdException(
          CfdError::kCfdOutOfRangeError,
          "Failed to parameter. buffer state is illegal.");
    }
    if (!buffer->has_collect_blinder) {
      warn(CFD_LOG_SOURCE, "unused collect blinder.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to collect state. unused collect blinder.");
    }
    if (index >= buffer->blinder_list->size()) {
      warn(CFD_LOG_SOURCE, "index out of range.");
      throw CfdException(
          CfdError::kCfdOutOfRangeError,
          "Failed to parameter. index out of range.");
    }

    auto& data = (*buffer->blinder_list)[index];
    if (vout != nullptr) *vout = data.vout;
    if (asset != nullptr) {
      work_asset = CreateString(data.asset.GetHex());
    }
    if (value_satoshi != nullptr) {
      *value_satoshi = data.value.GetAmount().GetSatoshiValue();
    }
    if (asset_blind_factor != nullptr) {
      work_asset_blind_factor = CreateString(data.abf.GetHex());
    }
    if (value_blind_factor != nullptr) {
      work_value_blind_factor = CreateString(data.vbf.GetHex());
    }
    if ((issuance_txid != nullptr) && (issuance_vout != nullptr)) {
      *issuance_vout = data.issuance_outpoint.GetVout();
      work_txid = CreateString(data.issuance_outpoint.GetTxid().GetHex());
    }
    if (is_issuance_asset != nullptr) *is_issuance_asset = data.is_issuance;
    if (is_issuance_token != nullptr) {
      *is_issuance_token = data.is_issuance_token;
    }

    if (work_asset != nullptr) *asset = work_asset;
    if (work_asset_blind_factor != nullptr)
      *asset_blind_factor = work_asset_blind_factor;
    if (work_value_blind_factor != nullptr)
      *value_blind_factor = work_value_blind_factor;
    if (work_txid != nullptr) *issuance_txid = work_txid;
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    result = SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
  }
  FreeBufferOnError(&work_asset, &work_asset_blind_factor);
  FreeBufferOnError(&work_value_blind_factor, &work_txid);
  return result;
}